

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::navigateToParent(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  char cVar1;
  long in_FS_OFFSET;
  QDir dir;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  undefined1 *local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModel::rootDirectory();
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  cVar1 = QDir::isRoot();
  if (cVar1 == '\0') {
    QDir::cdUp();
    QDir::absolutePath();
    local_68.ptr = (char16_t *)local_48._8_8_;
    local_68.d = (Data *)local_48.shared;
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = (char16_t *)0x0;
    local_68.size = local_48._16_8_;
    local_48._16_8_ = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  }
  else {
    QFileSystemModel::myComputer((int)&local_48);
    ::QVariant::toString();
    local_68.ptr = local_88.ptr;
    local_68.d = local_88.d;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_68.size = local_88.size;
    local_88.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  QFileDialog::setDirectory(this_00,(QString *)&local_68);
  QFileDialog::directoryEntered(this_00,(QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QDir::~QDir((QDir *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::navigateToParent()
{
    Q_Q(QFileDialog);
    QDir dir(model->rootDirectory());
    QString newDirectory;
    if (dir.isRoot()) {
        newDirectory = model->myComputer().toString();
    } else {
        dir.cdUp();
        newDirectory = dir.absolutePath();
    }
    q->setDirectory(newDirectory);
    emit q->directoryEntered(newDirectory);
}